

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall QDialogButtonBoxPrivate::handleButtonClicked(QDialogButtonBoxPrivate *this)

{
  QDialogButtonBox *this_00;
  bool bVar1;
  ButtonRole BVar2;
  QObject *object;
  QAbstractButton *button;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogButtonBox **)&(this->super_QWidgetPrivate).field_0x8;
  object = (QObject *)QObject::sender();
  button = QtPrivate::qobject_cast_helper<QAbstractButton*,QObject>(object);
  if (button != (QAbstractButton *)0x0) {
    BVar2 = QDialogButtonBox::buttonRole(this_00,button);
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QDialogButtonBox>::QPointer<void>
              ((QPointer<QDialogButtonBox> *)&local_38,(QDialogButtonBox *)this_00);
    QDialogButtonBox::clicked(this_00,button);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if (bVar1) {
      switch(BVar2) {
      case AcceptRole:
      case YesRole:
        QDialogButtonBox::accepted(this_00);
        break;
      case RejectRole:
      case NoRole:
        QDialogButtonBox::rejected(this_00);
        break;
      case HelpRole:
        QDialogButtonBox::helpRequested(this_00);
      }
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::handleButtonClicked()
{
    Q_Q(QDialogButtonBox);
    if (QAbstractButton *button = qobject_cast<QAbstractButton *>(q->sender())) {
        // Can't fetch this *after* emitting clicked, as clicked may destroy the button
        // or change its role. Now changing the role is not possible yet, but arguably
        // both clicked and accepted/rejected/etc. should be emitted "atomically"
        // depending on whatever role the button had at the time of the click.
        const QDialogButtonBox::ButtonRole buttonRole = q->buttonRole(button);
        QPointer<QDialogButtonBox> guard(q);

        emit q->clicked(button);

        if (!guard)
            return;

        switch (QPlatformDialogHelper::ButtonRole(buttonRole)) {
        case QPlatformDialogHelper::AcceptRole:
        case QPlatformDialogHelper::YesRole:
            emit q->accepted();
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::NoRole:
            emit q->rejected();
            break;
        case QPlatformDialogHelper::HelpRole:
            emit q->helpRequested();
            break;
        default:
            break;
        }
    }
}